

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::MacroTemplateToken::~MacroTemplateToken(MacroTemplateToken *this)

{
  (this->super_TemplateToken)._vptr_TemplateToken = (_func_int **)&PTR__MacroTemplateToken_0022e330;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ::~vector(&this->params);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->name).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  TemplateToken::~TemplateToken(&this->super_TemplateToken);
  return;
}

Assistant:

MacroTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<VariableExpr> && n, Expression::Parameters && p)
      : TemplateToken(Type::Macro, loc, pre, post), name(std::move(n)), params(std::move(p)) {}